

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O0

int __thiscall ncnn::Reshape::load_param(Reshape *this,ParamDict *pd)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  string *in_RSI;
  ParamDict *in_RDI;
  string *unaff_retaddr;
  int er;
  vector<int,_std::allocator<int>_> outshape;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> blobs;
  int blob_count;
  vector<int,_std::allocator<int>_> *in_stack_000002e0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_000002e8;
  string *in_stack_000002f0;
  allocator_type *__a;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *this_00;
  undefined4 in_stack_ffffffffffffff50;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff54;
  pointer in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  allocator_type local_89 [25];
  int local_70;
  undefined1 local_59 [33];
  string local_38 [32];
  string *local_18;
  int local_4;
  
  local_18 = in_RSI;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,0,-0xe9);
  *(int *)&in_RDI[0xd]._vptr_ParamDict = iVar1;
  iVar1 = ParamDict::get((ParamDict *)local_18,1,-0xe9);
  *(int *)((long)&in_RDI[0xd]._vptr_ParamDict + 4) = iVar1;
  iVar1 = ParamDict::get((ParamDict *)local_18,0xb,-0xe9);
  *(int *)&in_RDI[0xd].d = iVar1;
  iVar1 = ParamDict::get((ParamDict *)local_18,2,-0xe9);
  *(int *)((long)&in_RDI[0xd].d + 4) = iVar1;
  *(undefined4 *)&in_RDI[0xe]._vptr_ParamDict = 4;
  if (*(int *)&in_RDI[0xd].d == -0xe9) {
    *(undefined4 *)&in_RDI[0xe]._vptr_ParamDict = 3;
  }
  if (*(int *)((long)&in_RDI[0xd].d + 4) == -0xe9) {
    *(undefined4 *)&in_RDI[0xe]._vptr_ParamDict = 2;
  }
  if (*(int *)((long)&in_RDI[0xd]._vptr_ParamDict + 4) == -0xe9) {
    *(undefined4 *)&in_RDI[0xe]._vptr_ParamDict = 1;
  }
  if (*(int *)&in_RDI[0xd]._vptr_ParamDict == -0xe9) {
    *(undefined4 *)&in_RDI[0xe]._vptr_ParamDict = 0;
  }
  this_00 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  ParamDict::get(in_RDI,(int)((ulong)this_00 >> 0x20),local_18);
  std::__cxx11::string::operator=((string *)&in_RDI[0xe].d,local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string((string *)(local_59 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_59);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_70 = count_expression_blobs(unaff_retaddr);
    if (1 < local_70) {
      *(undefined1 *)&in_RDI->d = 0;
    }
    __a = local_89;
    std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0xf76d1d);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(this_00,(size_type)local_18,__a);
    std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0xf76d3d);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0xf76d4b);
    iVar1 = eval_list_expression(in_stack_000002f0,in_stack_000002e8,in_stack_000002e0);
    if (iVar1 == 0) {
      sVar3 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffff58);
      *(int *)&in_RDI[0xe]._vptr_ParamDict = (int)sVar3;
    }
    else {
      local_4 = -1;
    }
    uVar4 = (uint)(iVar1 != 0);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)__a);
    if (uVar4 != 0) {
      return local_4;
    }
  }
  return 0;
}

Assistant:

int Reshape::load_param(const ParamDict& pd)
{
    w = pd.get(0, -233);
    h = pd.get(1, -233);
    d = pd.get(11, -233);
    c = pd.get(2, -233);

    ndim = 4;
    if (d == -233)
        ndim = 3;
    if (c == -233)
        ndim = 2;
    if (h == -233)
        ndim = 1;
    if (w == -233)
        ndim = 0;

    shape_expr = pd.get(6, "");

    // count reference blobs
    if (!shape_expr.empty())
    {
        const int blob_count = count_expression_blobs(shape_expr);
        if (blob_count > 1)
            one_blob_only = false;

        // resolve ndim from expression
        std::vector<Mat> blobs(blob_count);
        std::vector<int> outshape;
        int er = eval_list_expression(shape_expr, blobs, outshape);
        if (er != 0)
            return -1;

        ndim = (int)outshape.size();
    }

    return 0;
}